

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_test.cc
# Opt level: O1

void __thiscall
fizplex::SimplexTest_EqualityRowBoundedVarsOptimalSolution_Test::
SimplexTest_EqualityRowBoundedVarsOptimalSolution_Test
          (SimplexTest_EqualityRowBoundedVarsOptimalSolution_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_SimplexTest).super_Test._vptr_Test = (_func_int **)&PTR__SimplexTest_001c4c60;
  LP::LP(&(this->super_SimplexTest).lp);
  DVector::DVector(&(this->super_SimplexTest).x,0);
  (this->super_SimplexTest).super_Test._vptr_Test = (_func_int **)&PTR__SimplexTest_001c4898;
  return;
}

Assistant:

TEST_F(SimplexTest, EqualityRowBoundedVarsOptimalSolution) {
  lp.add_column(ColType::Bounded, 0, 5, -1);
  lp.add_column(ColType::Bounded, 0, 5, 0);
  lp.add_row(RowType::Equality, 0, 0, {1, -1});

  solve_lp();
  EXPECT_EQ(Simplex::Result::OptimalSolution, result);
  EXPECT_DOUBLE_EQ(-5.0, z);
  EXPECT_EQ(DVector({5.0, 5.0, 0.0}), x);
}